

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_plan_generator.hpp
# Opt level: O2

PhysicalOperator * __thiscall
duckdb::PhysicalPlan::
Make<duckdb::PhysicalColumnDataScan,duckdb::vector<duckdb::LogicalType,true>&,duckdb::PhysicalOperatorType,unsigned_long&,unsigned_long&>
          (PhysicalPlan *this,vector<duckdb::LogicalType,_true> *args,PhysicalOperatorType *args_1,
          unsigned_long *args_2,unsigned_long *args_3)

{
  PhysicalColumnDataScan *this_00;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_50;
  reference_wrapper<duckdb::PhysicalOperator> local_38;
  
  this_00 = (PhysicalColumnDataScan *)ArenaAllocator::AllocateAligned(&this->arena,0xa0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_50,
             &args->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  PhysicalColumnDataScan::PhysicalColumnDataScan
            (this_00,(vector<duckdb::LogicalType,_true> *)&local_50,*args_1,*args_2,*args_3);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_50);
  local_38._M_data = (PhysicalOperator *)this_00;
  ::std::
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
  ::emplace_back<std::reference_wrapper<duckdb::PhysicalOperator>>
            ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
              *)&this->ops,&local_38);
  return &this_00->super_PhysicalOperator;
}

Assistant:

PhysicalOperator &Make(ARGS &&... args) {
		static_assert(std::is_base_of<PhysicalOperator, T>::value, "T must be a physical operator");
		auto mem = arena.AllocateAligned(sizeof(T));
		auto ptr = new (mem) T(std::forward<ARGS>(args)...);
		ops.push_back(*ptr);
		return *ptr;
	}